

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex2.cpp
# Opt level: O3

char * strdup(char *__s)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  
  if (__s == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    if (*__s == '\0') {
      lVar4 = 0;
    }
    else {
      lVar4 = 0;
      do {
        lVar2 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (__s[lVar2] != '\0');
      __s = __s + lVar4;
    }
    pcVar3 = (char *)operator_new__(lVar4 + 1);
    pcVar5 = __s + -lVar4;
    cVar1 = *pcVar5;
    while (cVar1 != '\0') {
      pcVar5 = pcVar5 + 1;
      *pcVar3 = cVar1;
      pcVar3 = pcVar3 + 1;
      cVar1 = *pcVar5;
    }
    *pcVar3 = '\0';
    pcVar3 = pcVar3 + -lVar4;
  }
  return pcVar3;
}

Assistant:

char *strdup(const char *str) {
  // check for nullptr
  if (!str) {
    return nullptr;
  }
  // get size of C string
  size_t size = 0;
  while (*str) {
    size++;
    str++;
  }
  // + 1 here to add space for \0 character
  char *s = new char[size + 1];
  // move pointer to the start of the string
  str -= size;
  while (*str) {
    *s++ = *str++;
  }
  // add terminating character
  *s = '\0';
  // move pointer to the start of the string
  s -= size;
  return s;
}